

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

v4sf * rfftb1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  v4sf *pafVar1;
  float *pfVar2;
  v4sf *pafVar3;
  v4sf *pafVar4;
  v4sf *pafVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  v4sf *pafVar13;
  v4sf *pafVar14;
  int iVar15;
  long lVar16;
  v4sf *pafVar17;
  v4sf *pafVar18;
  long lVar19;
  v4sf *pafVar20;
  ulong uVar21;
  v4sf *pafVar22;
  int iVar23;
  long lVar24;
  uint l1;
  long lVar25;
  long lVar26;
  v4sf *pafVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  v4sf *pafVar31;
  int ido;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  v4sf *local_108;
  v4sf *local_100;
  
  local_100 = work2;
  if (input_readonly == work2) {
    local_100 = work1;
  }
  if (local_100 != input_readonly) {
    iVar10 = ifac[1];
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    uVar12 = 1;
    uVar21 = 1;
    iVar23 = 0;
    local_108 = input_readonly;
    while( true ) {
      if (uVar21 == iVar10 + 1) {
        return local_108;
      }
      iVar8 = ifac[uVar21 + 1];
      l1 = (uint)uVar12;
      ido = n / (int)(iVar8 * l1);
      if (3 < iVar8 - 2U) break;
      lVar29 = (long)iVar23;
      lVar30 = (long)ido;
      lVar34 = (long)(int)l1;
      switch(iVar8) {
      case 2:
        radb2_ps(ido,l1,local_108,local_100,wa + lVar29);
        break;
      case 3:
        if ((int)l1 < 1) {
          uVar12 = 0;
        }
        pafVar14 = local_108;
        pafVar17 = local_100;
        uVar28 = uVar12;
        while (bVar35 = uVar28 != 0, uVar28 = uVar28 - 1, bVar35) {
          pafVar20 = pafVar14 + lVar30 * 2 + -1;
          fVar47 = (*pafVar20)[0] + (*pafVar20)[0];
          fVar36 = (*pafVar20)[1] + (*pafVar20)[1];
          fVar37 = (*pafVar20)[2] + (*pafVar20)[2];
          fVar38 = (*pafVar20)[3] + (*pafVar20)[3];
          fVar41 = (*pafVar14)[1];
          fVar43 = (*pafVar14)[2];
          fVar45 = (*pafVar14)[3];
          fVar39 = fVar47 * -0.5 + (*pafVar14)[0];
          fVar40 = fVar36 * -0.5 + fVar41;
          fVar42 = fVar37 * -0.5 + fVar43;
          fVar44 = fVar38 * -0.5 + fVar45;
          (*pafVar17)[0] = fVar47 + (*pafVar14)[0];
          (*pafVar17)[1] = fVar36 + fVar41;
          (*pafVar17)[2] = fVar37 + fVar43;
          (*pafVar17)[3] = fVar38 + fVar45;
          pafVar20 = pafVar14 + lVar30 * 2;
          fVar41 = (*pafVar20)[0] * 1.7320508;
          fVar43 = (*pafVar20)[1] * 1.7320508;
          fVar45 = (*pafVar20)[2] * 1.7320508;
          fVar47 = (*pafVar20)[3] * 1.7320508;
          pafVar20 = pafVar17 + lVar34 * lVar30;
          (*pafVar20)[0] = fVar39 - fVar41;
          (*pafVar20)[1] = fVar40 - fVar43;
          (*pafVar20)[2] = fVar42 - fVar45;
          (*pafVar20)[3] = fVar44 - fVar47;
          pfVar2 = (float *)((long)*pafVar17 + lVar30 * 0x10 * (long)(int)(l1 * 2));
          *pfVar2 = fVar41 + fVar39;
          pfVar2[1] = fVar43 + fVar40;
          pfVar2[2] = fVar45 + fVar42;
          pfVar2[3] = fVar47 + fVar44;
          pafVar17 = pafVar17 + lVar30;
          pafVar14 = pafVar14 + lVar30 * 3;
        }
        if (ido != 1) {
          for (uVar28 = 0; uVar28 != uVar12; uVar28 = uVar28 + 1) {
            lVar16 = (uVar28 * 3 + 2) * lVar30;
            lVar24 = (uVar28 * 3 + 1) * lVar30;
            lVar26 = uVar28 * 3 * lVar30;
            lVar25 = (uVar28 + lVar34) * lVar30;
            lVar32 = (uVar28 + (long)(int)(l1 * 2)) * lVar30;
            for (lVar11 = 2; lVar33 = lVar30 - lVar11, lVar33 != 0 && lVar11 <= lVar30;
                lVar11 = lVar11 + 2) {
              lVar19 = lVar11 + -1;
              pafVar14 = local_108 + lVar16 + lVar19;
              fVar41 = (*pafVar14)[0];
              fVar43 = (*pafVar14)[1];
              fVar45 = (*pafVar14)[2];
              fVar47 = (*pafVar14)[3];
              pfVar2 = (float *)((long)*local_108 +
                                ((long)(((ulong)(uint)((int)lVar24 + (int)lVar33) << 0x20) +
                                       -0x100000000) >> 0x1c));
              fVar36 = *pfVar2;
              fVar37 = pfVar2[1];
              fVar38 = pfVar2[2];
              fVar39 = pfVar2[3];
              fVar46 = fVar41 + fVar36;
              fVar48 = fVar43 + fVar37;
              fVar49 = fVar45 + fVar38;
              fVar50 = fVar47 + fVar39;
              pafVar14 = local_108 + lVar26 + lVar19;
              fVar40 = (*pafVar14)[1];
              fVar42 = (*pafVar14)[2];
              fVar44 = (*pafVar14)[3];
              fVar62 = (*pafVar14)[0] - fVar46 * 0.5;
              fVar57 = fVar40 - fVar48 * 0.5;
              fVar59 = fVar42 - fVar49 * 0.5;
              fVar61 = fVar44 - fVar50 * 0.5;
              pafVar17 = local_100 + uVar28 * lVar30 + lVar19;
              (*pafVar17)[0] = fVar46 + (*pafVar14)[0];
              (*pafVar17)[1] = fVar48 + fVar40;
              (*pafVar17)[2] = fVar49 + fVar42;
              (*pafVar17)[3] = fVar50 + fVar44;
              pafVar14 = local_108 + lVar16 + lVar11;
              fVar40 = (*pafVar14)[0];
              fVar42 = (*pafVar14)[1];
              fVar44 = (*pafVar14)[2];
              fVar46 = (*pafVar14)[3];
              pafVar14 = local_108 + lVar24 + lVar33;
              fVar48 = (*pafVar14)[0];
              fVar49 = (*pafVar14)[1];
              fVar50 = (*pafVar14)[2];
              fVar51 = (*pafVar14)[3];
              fVar63 = fVar40 - fVar48;
              fVar64 = fVar42 - fVar49;
              fVar65 = fVar44 - fVar50;
              fVar66 = fVar46 - fVar51;
              pafVar14 = local_108 + lVar26 + lVar11;
              fVar52 = (*pafVar14)[1];
              fVar53 = (*pafVar14)[2];
              fVar54 = (*pafVar14)[3];
              fVar55 = (*pafVar14)[0] - fVar63 * 0.5;
              fVar56 = fVar52 - fVar64 * 0.5;
              fVar58 = fVar53 - fVar65 * 0.5;
              fVar60 = fVar54 - fVar66 * 0.5;
              pafVar17 = local_100 + uVar28 * lVar30 + lVar11;
              (*pafVar17)[0] = fVar63 + (*pafVar14)[0];
              (*pafVar17)[1] = fVar64 + fVar52;
              (*pafVar17)[2] = fVar65 + fVar53;
              (*pafVar17)[3] = fVar66 + fVar54;
              fVar41 = (fVar41 - fVar36) * 0.8660254;
              fVar43 = (fVar43 - fVar37) * 0.8660254;
              fVar38 = (fVar45 - fVar38) * 0.8660254;
              fVar39 = (fVar47 - fVar39) * 0.8660254;
              fVar45 = (fVar40 + fVar48) * 0.8660254;
              fVar47 = (fVar42 + fVar49) * 0.8660254;
              fVar36 = (fVar44 + fVar50) * 0.8660254;
              fVar37 = (fVar46 + fVar51) * 0.8660254;
              fVar40 = fVar62 - fVar45;
              fVar42 = fVar57 - fVar47;
              fVar44 = fVar59 - fVar36;
              fVar46 = fVar61 - fVar37;
              fVar45 = fVar45 + fVar62;
              fVar47 = fVar47 + fVar57;
              fVar36 = fVar36 + fVar59;
              fVar37 = fVar37 + fVar61;
              fVar48 = fVar41 + fVar55;
              fVar49 = fVar43 + fVar56;
              fVar50 = fVar38 + fVar58;
              fVar51 = fVar39 + fVar60;
              fVar55 = fVar55 - fVar41;
              fVar56 = fVar56 - fVar43;
              fVar58 = fVar58 - fVar38;
              fVar60 = fVar60 - fVar39;
              fVar41 = wa[lVar29 + lVar11 + -2];
              fVar43 = wa[lVar29 + lVar11 + -1];
              pafVar14 = local_100 + lVar25 + lVar19;
              (*pafVar14)[0] = fVar40 * fVar41 - fVar43 * fVar48;
              (*pafVar14)[1] = fVar42 * fVar41 - fVar43 * fVar49;
              (*pafVar14)[2] = fVar44 * fVar41 - fVar43 * fVar50;
              (*pafVar14)[3] = fVar46 * fVar41 - fVar43 * fVar51;
              pafVar14 = local_100 + lVar25 + lVar11;
              (*pafVar14)[0] = fVar41 * fVar48 + fVar40 * fVar43;
              (*pafVar14)[1] = fVar41 * fVar49 + fVar42 * fVar43;
              (*pafVar14)[2] = fVar41 * fVar50 + fVar44 * fVar43;
              (*pafVar14)[3] = fVar41 * fVar51 + fVar46 * fVar43;
              fVar41 = wa[(long)(ido + iVar23) + lVar11 + -2];
              fVar43 = wa[(long)(ido + iVar23) + lVar11 + -1];
              pafVar14 = local_100 + lVar32 + lVar19;
              (*pafVar14)[0] = fVar45 * fVar41 - fVar43 * fVar55;
              (*pafVar14)[1] = fVar47 * fVar41 - fVar43 * fVar56;
              (*pafVar14)[2] = fVar36 * fVar41 - fVar43 * fVar58;
              (*pafVar14)[3] = fVar37 * fVar41 - fVar43 * fVar60;
              pafVar14 = local_100 + lVar32 + lVar11;
              (*pafVar14)[0] = fVar41 * fVar55 + fVar45 * fVar43;
              (*pafVar14)[1] = fVar41 * fVar56 + fVar47 * fVar43;
              (*pafVar14)[2] = fVar41 * fVar58 + fVar36 * fVar43;
              (*pafVar14)[3] = fVar41 * fVar60 + fVar37 * fVar43;
            }
          }
        }
        break;
      case 4:
        radb4_ps(ido,l1,local_108,local_100,wa + lVar29,wa + (ido + iVar23),
                 wa + (ido + iVar23 + ido));
        break;
      case 5:
        iVar15 = iVar23 + ido + ido;
        lVar26 = (long)(int)(~l1 * ido + -1);
        lVar11 = (long)~(ido * 6);
        pafVar14 = local_108 + lVar11 + 1;
        if ((int)l1 < 1) {
          uVar12 = 0;
        }
        iVar9 = (int)uVar12;
        lVar24 = ((long)(int)(l1 * 5) + 1) * lVar30;
        pafVar22 = local_100 + lVar24 + 1;
        lVar25 = ((long)(int)(l1 * 4) + 1) * lVar30;
        lVar16 = ((long)(int)(l1 * 3) + 1) * lVar30;
        lVar32 = ((long)(int)(l1 * 2) + 1) * lVar30;
        lVar34 = (lVar34 + 1) * lVar30;
        pafVar13 = local_100 + lVar25 + 1;
        pafVar17 = local_100 + lVar16 + 1;
        pafVar20 = local_100 + lVar32 + 1;
        pafVar18 = local_100 + lVar34 + 1;
        while (bVar35 = uVar12 != 0, uVar12 = uVar12 - 1, bVar35) {
          pafVar31 = pafVar14 + lVar30 * 8 + -1;
          pafVar27 = pafVar14 + lVar30 * 8;
          fVar36 = (*pafVar27)[0] + (*pafVar27)[0];
          fVar37 = (*pafVar27)[1] + (*pafVar27)[1];
          fVar38 = (*pafVar27)[2] + (*pafVar27)[2];
          fVar39 = (*pafVar27)[3] + (*pafVar27)[3];
          pafVar3 = pafVar14 + lVar30 * 10 + -1;
          pafVar27 = pafVar14 + lVar30 * 10;
          fVar48 = (*pafVar27)[0] + (*pafVar27)[0];
          fVar49 = (*pafVar27)[1] + (*pafVar27)[1];
          fVar50 = (*pafVar27)[2] + (*pafVar27)[2];
          fVar51 = (*pafVar27)[3] + (*pafVar27)[3];
          fVar56 = (*pafVar31)[0] + (*pafVar31)[0];
          fVar58 = (*pafVar31)[1] + (*pafVar31)[1];
          fVar60 = (*pafVar31)[2] + (*pafVar31)[2];
          fVar62 = (*pafVar31)[3] + (*pafVar31)[3];
          fVar40 = (*pafVar3)[0] + (*pafVar3)[0];
          fVar42 = (*pafVar3)[1] + (*pafVar3)[1];
          fVar44 = (*pafVar3)[2] + (*pafVar3)[2];
          fVar46 = (*pafVar3)[3] + (*pafVar3)[3];
          pafVar27 = pafVar14 + lVar30 * 6;
          fVar41 = (*pafVar27)[0];
          fVar43 = (*pafVar27)[1];
          fVar45 = (*pafVar27)[2];
          fVar47 = (*pafVar27)[3];
          pafVar27 = pafVar18 + lVar26;
          (*pafVar27)[0] = fVar56 + fVar40 + fVar41;
          (*pafVar27)[1] = fVar58 + fVar42 + fVar43;
          (*pafVar27)[2] = fVar60 + fVar44 + fVar45;
          (*pafVar27)[3] = fVar62 + fVar46 + fVar47;
          fVar52 = (fVar56 * 0.309017 - fVar40 * 0.809017) + fVar41;
          fVar53 = (fVar58 * 0.309017 - fVar42 * 0.809017) + fVar43;
          fVar54 = (fVar60 * 0.309017 - fVar44 * 0.809017) + fVar45;
          fVar55 = (fVar62 * 0.309017 - fVar46 * 0.809017) + fVar47;
          fVar41 = (fVar40 * 0.309017 - fVar56 * 0.809017) + fVar41;
          fVar43 = (fVar42 * 0.309017 - fVar58 * 0.809017) + fVar43;
          fVar45 = (fVar44 * 0.309017 - fVar60 * 0.809017) + fVar45;
          fVar47 = (fVar46 * 0.309017 - fVar62 * 0.809017) + fVar47;
          fVar40 = fVar48 * 0.58778524 + fVar36 * 0.95105654;
          fVar42 = fVar49 * 0.58778524 + fVar37 * 0.95105654;
          fVar44 = fVar50 * 0.58778524 + fVar38 * 0.95105654;
          fVar46 = fVar51 * 0.58778524 + fVar39 * 0.95105654;
          fVar36 = fVar36 * 0.58778524 - fVar48 * 0.95105654;
          fVar37 = fVar37 * 0.58778524 - fVar49 * 0.95105654;
          fVar38 = fVar38 * 0.58778524 - fVar50 * 0.95105654;
          fVar39 = fVar39 * 0.58778524 - fVar51 * 0.95105654;
          pafVar27 = pafVar20 + lVar26;
          (*pafVar27)[0] = fVar52 - fVar40;
          (*pafVar27)[1] = fVar53 - fVar42;
          (*pafVar27)[2] = fVar54 - fVar44;
          (*pafVar27)[3] = fVar55 - fVar46;
          pafVar27 = pafVar17 + lVar26;
          (*pafVar27)[0] = fVar41 - fVar36;
          (*pafVar27)[1] = fVar43 - fVar37;
          (*pafVar27)[2] = fVar45 - fVar38;
          (*pafVar27)[3] = fVar47 - fVar39;
          pafVar27 = pafVar13 + lVar26;
          (*pafVar27)[0] = fVar36 + fVar41;
          (*pafVar27)[1] = fVar37 + fVar43;
          (*pafVar27)[2] = fVar38 + fVar45;
          (*pafVar27)[3] = fVar39 + fVar47;
          pafVar27 = pafVar22 + lVar26;
          (*pafVar27)[0] = fVar40 + fVar52;
          (*pafVar27)[1] = fVar42 + fVar53;
          (*pafVar27)[2] = fVar44 + fVar54;
          (*pafVar27)[3] = fVar46 + fVar55;
          pafVar22 = pafVar22 + lVar30;
          pafVar13 = pafVar13 + lVar30;
          pafVar17 = pafVar17 + lVar30;
          pafVar20 = pafVar20 + lVar30;
          pafVar18 = pafVar18 + lVar30;
          pafVar14 = pafVar14 + lVar30 * 5;
        }
        if (ido != 1) {
          pafVar22 = local_100 + lVar26 + lVar24 + 3;
          pafVar14 = local_100 + lVar26 + lVar25 + 3;
          pafVar17 = local_100 + lVar26 + lVar16 + 3;
          pafVar20 = local_100 + lVar26 + lVar32 + 3;
          lVar16 = (long)(iVar15 + ido) * 4;
          lVar24 = (long)iVar15 * 4;
          lVar25 = (long)(iVar23 + ido) * 4;
          pafVar18 = local_100 + lVar26 + lVar34 + 3;
          lVar34 = (long)(ido * -6 + -2);
          pafVar31 = local_108 + lVar34 + lVar30 * 6 + 4;
          pafVar27 = local_108 + lVar34 + lVar30 * 10 + 4;
          pafVar13 = local_108 + lVar34 + lVar30 * 8 + 4;
          for (uVar12 = 1; uVar12 != iVar9 + 1; uVar12 = uVar12 + 1) {
            lVar33 = (uVar12 * 5 + 2) * lVar30;
            lVar32 = (uVar12 * 5 + 4) * lVar30;
            lVar26 = 0;
            iVar15 = ido + -1;
            for (lVar34 = 3; lVar34 <= lVar30; lVar34 = lVar34 + 2) {
              lVar19 = (long)iVar15;
              pafVar4 = local_108 + lVar11 + lVar33 + lVar19 + -1;
              pafVar3 = local_108 + lVar11 + lVar33 + lVar19;
              pafVar5 = local_108 + lVar11 + lVar32 + lVar19 + -1;
              pafVar1 = local_108 + lVar11 + lVar32 + lVar19;
              pfVar6 = pafVar13[-1] + lVar26;
              pfVar2 = *pafVar13 + lVar26;
              fVar36 = *pfVar2 + (*pafVar3)[0];
              fVar37 = pfVar2[1] + (*pafVar3)[1];
              fVar38 = pfVar2[2] + (*pafVar3)[2];
              fVar39 = pfVar2[3] + (*pafVar3)[3];
              fVar76 = *pfVar2 - (*pafVar3)[0];
              fVar77 = pfVar2[1] - (*pafVar3)[1];
              fVar78 = pfVar2[2] - (*pafVar3)[2];
              fVar79 = pfVar2[3] - (*pafVar3)[3];
              pfVar7 = pafVar27[-1] + lVar26;
              pfVar2 = *pafVar27 + lVar26;
              fVar56 = *pfVar2 + (*pafVar1)[0];
              fVar58 = pfVar2[1] + (*pafVar1)[1];
              fVar60 = pfVar2[2] + (*pafVar1)[2];
              fVar62 = pfVar2[3] + (*pafVar1)[3];
              fVar48 = *pfVar2 - (*pafVar1)[0];
              fVar49 = pfVar2[1] - (*pafVar1)[1];
              fVar50 = pfVar2[2] - (*pafVar1)[2];
              fVar51 = pfVar2[3] - (*pafVar1)[3];
              fVar64 = *pfVar6 - (*pafVar4)[0];
              fVar65 = pfVar6[1] - (*pafVar4)[1];
              fVar66 = pfVar6[2] - (*pafVar4)[2];
              fVar67 = pfVar6[3] - (*pafVar4)[3];
              fVar80 = *pfVar6 + (*pafVar4)[0];
              fVar81 = pfVar6[1] + (*pafVar4)[1];
              fVar82 = pfVar6[2] + (*pafVar4)[2];
              fVar83 = pfVar6[3] + (*pafVar4)[3];
              fVar68 = *pfVar7 - (*pafVar5)[0];
              fVar69 = pfVar7[1] - (*pafVar5)[1];
              fVar70 = pfVar7[2] - (*pafVar5)[2];
              fVar71 = pfVar7[3] - (*pafVar5)[3];
              fVar57 = *pfVar7 + (*pafVar5)[0];
              fVar59 = pfVar7[1] + (*pafVar5)[1];
              fVar61 = pfVar7[2] + (*pafVar5)[2];
              fVar63 = pfVar7[3] + (*pafVar5)[3];
              pfVar2 = pafVar31[-1] + lVar26;
              fVar41 = *pfVar2;
              fVar43 = pfVar2[1];
              fVar45 = pfVar2[2];
              fVar47 = pfVar2[3];
              pfVar2 = pafVar18[-1] + lVar26;
              *pfVar2 = fVar80 + fVar57 + fVar41;
              pfVar2[1] = fVar81 + fVar59 + fVar43;
              pfVar2[2] = fVar82 + fVar61 + fVar45;
              pfVar2[3] = fVar83 + fVar63 + fVar47;
              pfVar2 = *pafVar31 + lVar26;
              fVar40 = *pfVar2;
              fVar42 = pfVar2[1];
              fVar44 = pfVar2[2];
              fVar46 = pfVar2[3];
              pfVar2 = *pafVar18 + lVar26;
              *pfVar2 = fVar76 + fVar48 + fVar40;
              pfVar2[1] = fVar77 + fVar49 + fVar42;
              pfVar2[2] = fVar78 + fVar50 + fVar44;
              pfVar2[3] = fVar79 + fVar51 + fVar46;
              fVar52 = (fVar80 * 0.309017 - fVar57 * 0.809017) + fVar41;
              fVar53 = (fVar81 * 0.309017 - fVar59 * 0.809017) + fVar43;
              fVar54 = (fVar82 * 0.309017 - fVar61 * 0.809017) + fVar45;
              fVar55 = (fVar83 * 0.309017 - fVar63 * 0.809017) + fVar47;
              fVar72 = (fVar76 * 0.309017 - fVar48 * 0.809017) + fVar40;
              fVar73 = (fVar77 * 0.309017 - fVar49 * 0.809017) + fVar42;
              fVar74 = (fVar78 * 0.309017 - fVar50 * 0.809017) + fVar44;
              fVar75 = (fVar79 * 0.309017 - fVar51 * 0.809017) + fVar46;
              fVar41 = (fVar57 * 0.309017 - fVar80 * 0.809017) + fVar41;
              fVar43 = (fVar59 * 0.309017 - fVar81 * 0.809017) + fVar43;
              fVar45 = (fVar61 * 0.309017 - fVar82 * 0.809017) + fVar45;
              fVar47 = (fVar63 * 0.309017 - fVar83 * 0.809017) + fVar47;
              fVar40 = (fVar48 * 0.309017 - fVar76 * 0.809017) + fVar40;
              fVar42 = (fVar49 * 0.309017 - fVar77 * 0.809017) + fVar42;
              fVar44 = (fVar50 * 0.309017 - fVar78 * 0.809017) + fVar44;
              fVar46 = (fVar51 * 0.309017 - fVar79 * 0.809017) + fVar46;
              fVar76 = fVar68 * 0.58778524 + fVar64 * 0.95105654;
              fVar77 = fVar69 * 0.58778524 + fVar65 * 0.95105654;
              fVar78 = fVar70 * 0.58778524 + fVar66 * 0.95105654;
              fVar79 = fVar71 * 0.58778524 + fVar67 * 0.95105654;
              fVar80 = fVar56 * 0.58778524 + fVar36 * 0.95105654;
              fVar81 = fVar58 * 0.58778524 + fVar37 * 0.95105654;
              fVar82 = fVar60 * 0.58778524 + fVar38 * 0.95105654;
              fVar83 = fVar62 * 0.58778524 + fVar39 * 0.95105654;
              fVar57 = fVar64 * 0.58778524 - fVar68 * 0.95105654;
              fVar59 = fVar65 * 0.58778524 - fVar69 * 0.95105654;
              fVar61 = fVar66 * 0.58778524 - fVar70 * 0.95105654;
              fVar63 = fVar67 * 0.58778524 - fVar71 * 0.95105654;
              fVar48 = fVar36 * 0.58778524 - fVar56 * 0.95105654;
              fVar49 = fVar37 * 0.58778524 - fVar58 * 0.95105654;
              fVar50 = fVar38 * 0.58778524 - fVar60 * 0.95105654;
              fVar51 = fVar39 * 0.58778524 - fVar62 * 0.95105654;
              fVar56 = fVar41 - fVar48;
              fVar58 = fVar43 - fVar49;
              fVar60 = fVar45 - fVar50;
              fVar62 = fVar47 - fVar51;
              fVar48 = fVar48 + fVar41;
              fVar49 = fVar49 + fVar43;
              fVar50 = fVar50 + fVar45;
              fVar51 = fVar51 + fVar47;
              fVar68 = fVar57 + fVar40;
              fVar69 = fVar59 + fVar42;
              fVar70 = fVar61 + fVar44;
              fVar71 = fVar63 + fVar46;
              fVar40 = fVar40 - fVar57;
              fVar42 = fVar42 - fVar59;
              fVar44 = fVar44 - fVar61;
              fVar46 = fVar46 - fVar63;
              fVar57 = fVar80 + fVar52;
              fVar59 = fVar81 + fVar53;
              fVar61 = fVar82 + fVar54;
              fVar63 = fVar83 + fVar55;
              fVar52 = fVar52 - fVar80;
              fVar53 = fVar53 - fVar81;
              fVar54 = fVar54 - fVar82;
              fVar55 = fVar55 - fVar83;
              fVar64 = fVar72 - fVar76;
              fVar65 = fVar73 - fVar77;
              fVar66 = fVar74 - fVar78;
              fVar67 = fVar75 - fVar79;
              fVar76 = fVar76 + fVar72;
              fVar77 = fVar77 + fVar73;
              fVar78 = fVar78 + fVar74;
              fVar79 = fVar79 + fVar75;
              fVar41 = *(float *)((long)wa + lVar26 + lVar29 * 4);
              fVar43 = *(float *)((long)wa + lVar26 + lVar29 * 4 + 4);
              fVar45 = *(float *)((long)wa + lVar26 + lVar25);
              fVar47 = *(float *)((long)wa + lVar26 + lVar25 + 4);
              fVar36 = *(float *)((long)wa + lVar26 + lVar24);
              fVar37 = *(float *)((long)wa + lVar26 + lVar24 + 4);
              fVar38 = *(float *)((long)wa + lVar26 + lVar16);
              fVar39 = *(float *)((long)wa + lVar26 + lVar16 + 4);
              pfVar2 = pafVar20[-1] + lVar26;
              *pfVar2 = fVar52 * fVar41 - fVar43 * fVar76;
              pfVar2[1] = fVar53 * fVar41 - fVar43 * fVar77;
              pfVar2[2] = fVar54 * fVar41 - fVar43 * fVar78;
              pfVar2[3] = fVar55 * fVar41 - fVar43 * fVar79;
              pfVar2 = *pafVar20 + lVar26;
              *pfVar2 = fVar41 * fVar76 + fVar52 * fVar43;
              pfVar2[1] = fVar41 * fVar77 + fVar53 * fVar43;
              pfVar2[2] = fVar41 * fVar78 + fVar54 * fVar43;
              pfVar2[3] = fVar41 * fVar79 + fVar55 * fVar43;
              pfVar2 = pafVar17[-1] + lVar26;
              *pfVar2 = fVar56 * fVar45 - fVar47 * fVar68;
              pfVar2[1] = fVar58 * fVar45 - fVar47 * fVar69;
              pfVar2[2] = fVar60 * fVar45 - fVar47 * fVar70;
              pfVar2[3] = fVar62 * fVar45 - fVar47 * fVar71;
              pfVar2 = *pafVar17 + lVar26;
              *pfVar2 = fVar45 * fVar68 + fVar56 * fVar47;
              pfVar2[1] = fVar45 * fVar69 + fVar58 * fVar47;
              pfVar2[2] = fVar45 * fVar70 + fVar60 * fVar47;
              pfVar2[3] = fVar45 * fVar71 + fVar62 * fVar47;
              pfVar2 = pafVar14[-1] + lVar26;
              *pfVar2 = fVar48 * fVar36 - fVar37 * fVar40;
              pfVar2[1] = fVar49 * fVar36 - fVar37 * fVar42;
              pfVar2[2] = fVar50 * fVar36 - fVar37 * fVar44;
              pfVar2[3] = fVar51 * fVar36 - fVar37 * fVar46;
              pfVar2 = *pafVar14 + lVar26;
              *pfVar2 = fVar36 * fVar40 + fVar48 * fVar37;
              pfVar2[1] = fVar36 * fVar42 + fVar49 * fVar37;
              pfVar2[2] = fVar36 * fVar44 + fVar50 * fVar37;
              pfVar2[3] = fVar36 * fVar46 + fVar51 * fVar37;
              pfVar2 = pafVar22[-1] + lVar26;
              *pfVar2 = fVar57 * fVar38 - fVar39 * fVar64;
              pfVar2[1] = fVar59 * fVar38 - fVar39 * fVar65;
              pfVar2[2] = fVar61 * fVar38 - fVar39 * fVar66;
              pfVar2[3] = fVar63 * fVar38 - fVar39 * fVar67;
              pfVar2 = *pafVar22 + lVar26;
              *pfVar2 = fVar38 * fVar64 + fVar57 * fVar39;
              pfVar2[1] = fVar38 * fVar65 + fVar59 * fVar39;
              pfVar2[2] = fVar38 * fVar66 + fVar61 * fVar39;
              pfVar2[3] = fVar38 * fVar67 + fVar63 * fVar39;
              lVar26 = lVar26 + 8;
              iVar15 = iVar15 + -2;
            }
            pafVar22 = pafVar22 + lVar30;
            pafVar14 = pafVar14 + lVar30;
            pafVar17 = pafVar17 + lVar30;
            pafVar20 = pafVar20 + lVar30;
            pafVar18 = pafVar18 + lVar30;
            pafVar31 = pafVar31 + lVar30 * 5;
            pafVar27 = pafVar27 + lVar30 * 5;
            pafVar13 = pafVar13 + lVar30 * 5;
          }
        }
      }
      uVar21 = uVar21 + 1;
      iVar23 = iVar23 + (iVar8 + -1) * ido;
      bVar35 = local_100 == work2;
      local_108 = work1;
      local_100 = work2;
      if (bVar35) {
        local_108 = work2;
        local_100 = work1;
      }
      uVar12 = (ulong)(iVar8 * l1);
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x40f,
                  "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x3f6,
                "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
}

Assistant:

static NEVER_INLINE(v4sf *) rfftb1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l1 = 1;
  int iw = 0;
  assert(in != out);
  for (k1=1; k1<=nf; k1++) {
    int ip = ifac[k1 + 1];
    int l2 = ip*l1;
    int ido = n / l2;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radb5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radb4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radb3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radb2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l1 = l2;
    iw += (ip - 1)*ido;

    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}